

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  once_flag *__once;
  GeneratorOptions *options_00;
  LogMessage *other;
  Descriptor *from_file;
  Descriptor *in_R8;
  GeneratorOptions *local_68;
  code *local_60 [7];
  
  __once = *(once_flag **)((long)&(options->output_dir).field_2 + 8);
  if (__once != (once_flag *)0x0) {
    local_60[0] = FieldDescriptor::TypeOnceInit;
    local_68 = options;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (__once,local_60,(FieldDescriptor **)&local_68);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
              (ulong)*(byte *)((long)&(options->output_dir)._M_dataplus._M_p + 2) * 4) != 10) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0xf1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_60,
                       "CHECK failed: field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
  }
  options_00 = (GeneratorOptions *)(options->output_dir).field_2._M_allocated_capacity;
  from_file = FieldDescriptor::message_type((FieldDescriptor *)options);
  MaybeCrossFileRef_abi_cxx11_
            (__return_storage_ptr__,this,options_00,(FileDescriptor *)from_file,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string SubmessageTypeRef(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  GOOGLE_CHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE);
  return MaybeCrossFileRef(options, field->file(), field->message_type());
}